

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RootObjectBase.cpp
# Opt level: O0

BOOL __thiscall
Js::RootObjectBase::HasOwnPropertyCheckNoRedecl(RootObjectBase *this,PropertyId propertyId)

{
  int iVar1;
  DynamicTypeHandler *pDVar2;
  ScriptContext *scriptContext;
  byte local_1d;
  uint local_1c;
  bool noRedecl;
  RootObjectBase *pRStack_18;
  PropertyId propertyId_local;
  RootObjectBase *this_local;
  
  local_1d = 0;
  local_1c = propertyId;
  pRStack_18 = this;
  pDVar2 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  iVar1 = (*pDVar2->_vptr_DynamicTypeHandler[0x1f])(pDVar2,this,(ulong)local_1c,&local_1d,0);
  if (iVar1 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    if ((local_1d & 1) != 0) {
      scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      JavascriptError::ThrowReferenceError(scriptContext,-0x7ff5fbe4,(PCWSTR)0x0);
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL
    RootObjectBase::HasOwnPropertyCheckNoRedecl(PropertyId propertyId)
    {
        bool noRedecl = false;
        if (!GetTypeHandler()->HasRootProperty(this, propertyId, &noRedecl))
        {
            return FALSE;
        }
        else if (noRedecl)
        {
            JavascriptError::ThrowReferenceError(GetScriptContext(), ERRRedeclaration);
        }
        return true;
    }